

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdPrintCofactors(uint *pTruth,int nVars,int nCofLevel,int fVerbose)

{
  Kit_DsdObj_t KVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Kit_DsdNtk_t *pKVar10;
  Kit_DsdNtk_t *pKVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  uint **ppuVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  int piCofVar [5];
  long local_328;
  int local_2d8 [5];
  int local_2c4;
  uint *local_2c0;
  uint *local_2b8 [16];
  uint *local_238 [16];
  undefined8 auStack_1b8 [16];
  undefined8 auStack_138 [16];
  undefined8 auStack_b8 [17];
  
  if (4 < nCofLevel) {
    __assert_fail("nCofLevel < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0xafb,"void Kit_DsdPrintCofactors(unsigned int *, int, int, int)");
  }
  pKVar10 = Kit_DsdDecomposeInt(pTruth,nVars,0);
  pKVar11 = Kit_DsdExpand(pKVar10);
  Kit_DsdNtkFree(pKVar10);
  if (fVerbose != 0) {
    Kit_DsdPrint(_stdout,pKVar11);
    putchar(10);
  }
  Kit_DsdNtkFree(pKVar11);
  bVar13 = (byte)(nVars + -5);
  iVar4 = 0x50 << (bVar13 & 0x1f);
  if (nVars < 6) {
    iVar4 = 0x50;
  }
  iVar5 = nVars + -5;
  if (nVars < 6) {
    iVar5 = 0;
  }
  local_2b8[0] = (uint *)malloc((long)iVar4 << 2);
  ppuVar15 = local_2b8;
  lVar20 = 0;
  iVar4 = 0;
  do {
    iVar8 = iVar4;
    lVar21 = 0;
    do {
      ppuVar15[lVar21] = local_2b8[0] + (iVar8 + (int)lVar21 << ((byte)iVar5 & 0x1f));
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x10);
    lVar20 = lVar20 + 1;
    ppuVar15 = ppuVar15 + 0x10;
    iVar4 = iVar8 + 0x10;
  } while (lVar20 != 5);
  uVar17 = 1 << (bVar13 & 0x1f);
  if (nVars < 6) {
    uVar17 = 1;
  }
  if (iVar8 != 0x40) {
    __assert_fail("nSize == 80",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0xb0c,"void Kit_DsdPrintCofactors(unsigned int *, int, int, int)");
  }
  if (0 < (int)uVar17) {
    uVar12 = (ulong)uVar17 + 1;
    do {
      local_2b8[0][uVar12 - 2] = pTruth[uVar12 - 2];
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  local_2c0 = local_2b8[0];
  switch(nCofLevel) {
  case 1:
    if (0 < nVars) {
      iVar4 = 0;
      do {
        printf("    Variables { ");
        printf("%c ",(ulong)(iVar4 + 0x61));
        puts("}");
        puVar2 = local_2c0;
        Kit_TruthCofactor0New(local_238[0],local_2c0,nVars,iVar4);
        Kit_TruthCofactor1New(local_238[1],puVar2,nVars,iVar4);
        lVar20 = 0;
        uVar17 = 0;
        uVar12 = 0;
        bVar3 = true;
        do {
          bVar22 = bVar3;
          puVar2 = local_238[lVar20];
          pKVar10 = Kit_DsdDecomposeInt(puVar2,nVars,0);
          pKVar11 = Kit_DsdExpand(pKVar10);
          Kit_DsdNtkFree(pKVar10);
          if (fVerbose != 0) {
            printf("Cof%d%d: ",1,lVar20);
            Kit_DsdPrint(_stdout,pKVar11);
            putchar(10);
          }
          if ((ulong)pKVar11->nNodes == 0) {
            uVar24 = 0;
          }
          else {
            uVar25 = 0;
            uVar24 = 0;
            do {
              if (pKVar11->pNodes[uVar25] == (Kit_DsdObj_t *)0x0) break;
              KVar1 = *pKVar11->pNodes[uVar25];
              uVar19 = (uint)KVar1 >> 0x1a;
              if (uVar19 < uVar24) {
                uVar19 = uVar24;
              }
              if (((uint)KVar1 & 0x1c0) == 0x140) {
                uVar24 = uVar19;
              }
              uVar25 = uVar25 + 1;
            } while (pKVar11->nNodes != uVar25);
          }
          if (uVar24 < (uint)uVar12) {
            uVar24 = (uint)uVar12;
          }
          uVar12 = (ulong)uVar24;
          Kit_DsdNtkFree(pKVar11);
          iVar5 = Kit_TruthSupportSize(puVar2,nVars);
          uVar17 = uVar17 + iVar5;
          lVar20 = 1;
          bVar3 = false;
        } while (bVar22);
        printf("Max = %2d. Supps = %2d.\n",uVar12,(ulong)uVar17);
        iVar4 = iVar4 + 1;
      } while (iVar4 != nVars);
    }
    break;
  case 2:
    if (nVars < 1) break;
    iVar4 = 0;
    do {
      iVar5 = iVar4 + 1;
      if (iVar5 < nVars) {
        iVar8 = iVar5;
        do {
          local_2d8[0] = iVar4;
          local_2d8[1] = iVar8;
          printf("    Variables { ");
          printf("%c ",iVar4 + 0x61);
          printf("%c ",(ulong)(iVar8 + 0x61));
          puts("}");
          local_328 = 1;
          do {
            ppuVar15 = local_2b8;
            lVar20 = 0;
            do {
              lVar21 = lVar20 + 1;
              iVar7 = local_2d8[lVar20];
              lVar23 = 0x40;
              uVar17 = 1;
              do {
                puVar2 = *(uint **)((long)ppuVar15 + lVar23 + -0x40);
                Kit_TruthCofactor0New(*(uint **)((long)ppuVar15 + lVar23 * 2),puVar2,nVars,iVar7);
                Kit_TruthCofactor1New
                          (*(uint **)((long)ppuVar15 + lVar23 * 2 + 8),puVar2,nVars,iVar7);
                lVar23 = lVar23 + 8;
                uVar24 = uVar17 >> ((byte)lVar20 & 0x1f);
                uVar17 = uVar17 + 1;
              } while (uVar24 == 0);
              ppuVar15 = ppuVar15 + 0x10;
              lVar20 = lVar21;
            } while (lVar21 != local_328);
            local_328 = local_328 + 1;
          } while (local_328 != 3);
          uVar12 = 0;
          uVar17 = 0;
          uVar24 = 0;
          do {
            puVar2 = (uint *)auStack_1b8[uVar12];
            pKVar10 = Kit_DsdDecomposeInt(puVar2,nVars,0);
            pKVar11 = Kit_DsdExpand(pKVar10);
            Kit_DsdNtkFree(pKVar10);
            if (fVerbose != 0) {
              printf("Cof%d%d: ",2,uVar12 & 0xffffffff);
              Kit_DsdPrint(_stdout,pKVar11);
              putchar(10);
            }
            if ((ulong)pKVar11->nNodes == 0) {
              uVar19 = 0;
            }
            else {
              uVar25 = 0;
              uVar19 = 0;
              do {
                if (pKVar11->pNodes[uVar25] == (Kit_DsdObj_t *)0x0) break;
                KVar1 = *pKVar11->pNodes[uVar25];
                uVar18 = (uint)KVar1 >> 0x1a;
                if (uVar18 < uVar19) {
                  uVar18 = uVar19;
                }
                if (((uint)KVar1 & 0x1c0) == 0x140) {
                  uVar19 = uVar18;
                }
                uVar25 = uVar25 + 1;
              } while (pKVar11->nNodes != uVar25);
            }
            if (uVar19 < uVar24) {
              uVar19 = uVar24;
            }
            uVar24 = uVar19;
            Kit_DsdNtkFree(pKVar11);
            iVar7 = Kit_TruthSupportSize(puVar2,nVars);
            uVar17 = uVar17 + iVar7;
            uVar12 = uVar12 + 1;
          } while (uVar12 != 4);
          printf("Max = %2d. Supps = %2d.\n",(ulong)uVar24,(ulong)uVar17);
          iVar8 = iVar8 + 1;
        } while (iVar8 != nVars);
      }
      iVar4 = iVar5;
    } while (iVar5 != nVars);
    if (nCofLevel == 4) goto switchD_005de1bb_caseD_4;
    if (nCofLevel != 3) break;
  case 3:
    if (0 < nVars) {
      iVar4 = 0;
      do {
        iVar8 = iVar4 + 1;
        iVar5 = iVar8;
        if (iVar8 < nVars) {
          do {
            iVar6 = iVar5 + 1;
            for (iVar7 = iVar6; iVar7 < nVars; iVar7 = iVar7 + 1) {
              local_2d8[0] = iVar4;
              local_2d8[1] = iVar5;
              local_2d8[2] = iVar7;
              printf("    Variables { ");
              lVar20 = 0;
              do {
                printf("%c ",(ulong)(local_2d8[lVar20] + 0x61));
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              puts("}");
              local_328 = 1;
              do {
                ppuVar15 = local_2b8;
                lVar20 = 0;
                do {
                  lVar21 = lVar20 + 1;
                  iVar14 = local_2d8[lVar20];
                  lVar23 = 0x44;
                  uVar17 = 1;
                  do {
                    puVar2 = *(uint **)((long)ppuVar15 + lVar23 + -0x44);
                    Kit_TruthCofactor0New
                              (*(uint **)((long)ppuVar15 + lVar23 * 2 + -8),puVar2,nVars,iVar14);
                    Kit_TruthCofactor1New
                              (*(uint **)((long)ppuVar15 + lVar23 * 2),puVar2,nVars,iVar14);
                    lVar23 = lVar23 + 8;
                    uVar24 = uVar17 >> ((byte)lVar20 & 0x1f);
                    uVar17 = uVar17 + 1;
                  } while (uVar24 == 0);
                  ppuVar15 = ppuVar15 + 0x10;
                  lVar20 = lVar21;
                } while (lVar21 != local_328);
                local_328 = local_328 + 1;
              } while (local_328 != 4);
              uVar12 = 0;
              uVar17 = 0;
              uVar24 = 0;
              do {
                puVar2 = (uint *)auStack_138[uVar12];
                pKVar10 = Kit_DsdDecomposeInt(puVar2,nVars,0);
                pKVar11 = Kit_DsdExpand(pKVar10);
                Kit_DsdNtkFree(pKVar10);
                if (fVerbose != 0) {
                  printf("Cof%d%d: ",3,uVar12 & 0xffffffff);
                  Kit_DsdPrint(_stdout,pKVar11);
                  putchar(10);
                }
                if ((ulong)pKVar11->nNodes == 0) {
                  uVar19 = 0;
                }
                else {
                  uVar25 = 0;
                  uVar19 = 0;
                  do {
                    if (pKVar11->pNodes[uVar25] == (Kit_DsdObj_t *)0x0) break;
                    KVar1 = *pKVar11->pNodes[uVar25];
                    uVar18 = (uint)KVar1 >> 0x1a;
                    if (uVar18 < uVar19) {
                      uVar18 = uVar19;
                    }
                    if (((uint)KVar1 & 0x1c0) == 0x140) {
                      uVar19 = uVar18;
                    }
                    uVar25 = uVar25 + 1;
                  } while (pKVar11->nNodes != uVar25);
                }
                if (uVar19 < uVar24) {
                  uVar19 = uVar24;
                }
                uVar24 = uVar19;
                Kit_DsdNtkFree(pKVar11);
                iVar14 = Kit_TruthSupportSize(puVar2,nVars);
                uVar17 = uVar17 + iVar14;
                uVar12 = uVar12 + 1;
              } while (uVar12 != 8);
              printf("Max = %2d. Supps = %2d.\n",(ulong)uVar24,(ulong)uVar17);
            }
            iVar5 = iVar6;
          } while (iVar6 != nVars);
        }
        iVar4 = iVar8;
      } while (iVar8 != nVars);
      if (nCofLevel == 4 && 0 < nVars) {
LAB_005de82b:
        iVar4 = 0;
        do {
          local_2c4 = iVar4 + 1;
          iVar5 = local_2c4;
          if (local_2c4 < nVars) {
            do {
              iVar7 = iVar5 + 1;
              iVar8 = iVar7;
              while ((iVar6 = iVar8, iVar6 < nVars &&
                     (iVar8 = iVar6 + 1, iVar14 = iVar8, iVar8 < nVars))) {
                do {
                  local_2d8[0] = iVar4;
                  local_2d8[1] = iVar5;
                  local_2d8[2] = iVar6;
                  local_2d8[3] = iVar14;
                  printf("    Variables { ");
                  lVar20 = 0;
                  do {
                    printf("%c ",(ulong)(local_2d8[lVar20] + 0x61));
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 4);
                  puts("}");
                  local_328 = 1;
                  do {
                    ppuVar15 = local_2b8;
                    lVar20 = 0;
                    do {
                      lVar21 = lVar20 + 1;
                      iVar9 = local_2d8[lVar20];
                      lVar23 = 0x44;
                      uVar17 = 1;
                      do {
                        puVar2 = *(uint **)((long)ppuVar15 + lVar23 + -0x44);
                        Kit_TruthCofactor0New
                                  (*(uint **)((long)ppuVar15 + lVar23 * 2 + -8),puVar2,nVars,iVar9);
                        Kit_TruthCofactor1New
                                  (*(uint **)((long)ppuVar15 + lVar23 * 2),puVar2,nVars,iVar9);
                        lVar23 = lVar23 + 8;
                        uVar24 = uVar17 >> ((byte)lVar20 & 0x1f);
                        uVar17 = uVar17 + 1;
                      } while (uVar24 == 0);
                      ppuVar15 = ppuVar15 + 0x10;
                      lVar20 = lVar21;
                    } while (lVar21 != local_328);
                    local_328 = local_328 + 1;
                  } while (local_328 != 5);
                  uVar25 = 0;
                  uVar17 = 0;
                  uVar12 = 0;
                  do {
                    puVar2 = (uint *)auStack_b8[uVar25];
                    pKVar10 = Kit_DsdDecomposeInt(puVar2,nVars,0);
                    pKVar11 = Kit_DsdExpand(pKVar10);
                    Kit_DsdNtkFree(pKVar10);
                    if (fVerbose != 0) {
                      printf("Cof%d%d: ",4,uVar25 & 0xffffffff);
                      Kit_DsdPrint(_stdout,pKVar11);
                      putchar(10);
                    }
                    if ((ulong)pKVar11->nNodes == 0) {
                      uVar24 = 0;
                    }
                    else {
                      uVar16 = 0;
                      uVar24 = 0;
                      do {
                        if (pKVar11->pNodes[uVar16] == (Kit_DsdObj_t *)0x0) break;
                        KVar1 = *pKVar11->pNodes[uVar16];
                        uVar19 = (uint)KVar1 >> 0x1a;
                        if (uVar19 < uVar24) {
                          uVar19 = uVar24;
                        }
                        if (((uint)KVar1 & 0x1c0) == 0x140) {
                          uVar24 = uVar19;
                        }
                        uVar16 = uVar16 + 1;
                      } while (pKVar11->nNodes != uVar16);
                    }
                    uVar16 = (ulong)uVar24;
                    if (uVar24 < (uint)uVar12) {
                      uVar16 = uVar12;
                    }
                    Kit_DsdNtkFree(pKVar11);
                    iVar9 = Kit_TruthSupportSize(puVar2,nVars);
                    uVar17 = uVar17 + iVar9;
                    uVar25 = uVar25 + 1;
                    uVar12 = uVar16;
                  } while (uVar25 != 0x10);
                  printf("Max = %2d. Supps = %2d.\n",uVar16,(ulong)uVar17);
                  iVar14 = iVar14 + 1;
                } while (iVar14 < nVars);
              }
              iVar5 = iVar7;
            } while (iVar7 != nVars);
          }
          iVar4 = local_2c4;
        } while (local_2c4 != nVars);
      }
    }
    break;
  case 4:
switchD_005de1bb_caseD_4:
    if (nVars < 1) break;
    goto LAB_005de82b;
  }
  if (local_2c0 != (uint *)0x0) {
    free(local_2c0);
    return;
  }
  return;
}

Assistant:

void Kit_DsdPrintCofactors( unsigned * pTruth, int nVars, int nCofLevel, int fVerbose )
{
    Kit_DsdNtk_t * ppNtks[32] = {0}, * pTemp;
    unsigned * ppCofs[5][16];
    int piCofVar[5];
    int nPrimeSizeMax, nPrimeSizeCur, nSuppSizeMax;
    int i, k, v1, v2, v3, v4, s, nSteps, nSize, nMemSize;
    assert( nCofLevel < 5 );

    // print the function
    ppNtks[0] = Kit_DsdDecompose( pTruth, nVars );
    ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );
    Kit_DsdNtkFree( pTemp );
    if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[0] ), printf( "\n" );
    Kit_DsdNtkFree( ppNtks[0] );

    // allocate storage for cofactors
    nMemSize = Kit_TruthWordNum(nVars);
    ppCofs[0][0] = ABC_ALLOC( unsigned, 80 * nMemSize );
    nSize = 0;
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        ppCofs[i][k] = ppCofs[0][0] + nMemSize * nSize++;
    assert( nSize == 80 );

    // copy the function
    Kit_TruthCopy( ppCofs[0][0], pTruth, nVars );

    if ( nCofLevel == 1 )
    for ( v1 = 0; v1 < nVars; v1++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 2 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 3 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    for ( v3 = v2+1; v3 < nVars; v3++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;
        piCofVar[nSteps++] = v3;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 4 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    for ( v3 = v2+1; v3 < nVars; v3++ )
    for ( v4 = v3+1; v4 < nVars; v4++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;
        piCofVar[nSteps++] = v3;
        piCofVar[nSteps++] = v4;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }


    ABC_FREE( ppCofs[0][0] );
}